

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O0

void __thiscall
ft::
treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
::fixInsertViolation
          (treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           *this,node *z)

{
  treeNode<ft::pair<const_int,_int>_> *ptVar1;
  node *pnVar2;
  bool bVar3;
  node *y_1;
  node *y;
  node *z_local;
  treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  *this_local;
  
  y = z;
  while( true ) {
    pnVar2 = root(this);
    bVar3 = false;
    if ((y != pnVar2) && (bVar3 = false, y->colour != BLACK)) {
      bVar3 = y->parent->colour == RED;
    }
    if (!bVar3) break;
    if (y->parent == y->parent->parent->left) {
      ptVar1 = y->parent->parent->right;
      if (ptVar1->colour == RED) {
        y->parent->colour = BLACK;
        ptVar1->colour = BLACK;
        y->parent->parent->colour = RED;
        y = y->parent->parent;
      }
      else {
        if (y == y->parent->right) {
          y = y->parent;
          rotateLeft(this,y);
        }
        y->parent->colour = BLACK;
        y->parent->parent->colour = RED;
        rotateRight(this,y->parent->parent);
      }
    }
    else if (y->parent == y->parent->parent->right) {
      ptVar1 = y->parent->parent->left;
      if (ptVar1->colour == RED) {
        y->parent->colour = BLACK;
        ptVar1->colour = BLACK;
        y->parent->parent->colour = RED;
        y = y->parent->parent;
      }
      else {
        if (y == y->parent->left) {
          y = y->parent;
          rotateRight(this,y);
        }
        y->parent->colour = BLACK;
        y->parent->parent->colour = RED;
        rotateLeft(this,y->parent->parent);
      }
    }
  }
  pnVar2 = root(this);
  pnVar2->colour = BLACK;
  return;
}

Assistant:

void fixInsertViolation(node* z)
	{
		while (z != this->root() && z->colour != BLACK && z->parent->colour == RED)
		{
			// parent is left child of grandparent
			if (z->parent == z->parent->parent->left)
			{
				node*	y = z->parent->parent->right;
				if (y->colour == RED)
				{
					z->parent->colour = BLACK;
					y->colour = BLACK;
					z->parent->parent->colour = RED;
					z = z->parent->parent;
				}
				else
				{
					// node is right child of parent, rotate left
					if (z == z->parent->right)
					{
						z = z->parent;
						rotateLeft(z);
					}
					// node is left child of parent, swap parent and grandparent colour and rotate right
					z->parent->colour = BLACK;
					z->parent->parent->colour = RED;
					rotateRight(z->parent->parent);
				}
			}
				// parent is right child of grandparent
			else if (z->parent == z->parent->parent->right)
			{
				node*	y = z->parent->parent->left;
				if (y->colour == RED)
				{
					z->parent->colour = BLACK;
					y->colour = BLACK;
					z->parent->parent->colour = RED;
					z = z->parent->parent;
				}
				else
				{
					// node is left child of parent, rotate right
					if (z == z->parent->left)
					{
						z = z->parent;
						rotateRight(z);
					}
					// node is right child of parent, swap parent and grandparent colour and rotate left
					z->parent->colour = BLACK;
					z->parent->parent->colour = RED;
					rotateLeft(z->parent->parent);
				}
			}
		}
		this->root()->colour = BLACK;
	}